

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void __thiscall ON_3dmGoo::~ON_3dmGoo(ON_3dmGoo *this)

{
  ON_3dmGoo *pOVar1;
  ON_3dmGoo *pOVar2;
  
  pOVar1 = this->m_next_goo;
  pOVar2 = this->m_prev_goo;
  if (pOVar2 != (ON_3dmGoo *)0x0) {
    pOVar2->m_next_goo = pOVar1;
  }
  if (pOVar1 != (ON_3dmGoo *)0x0) {
    pOVar1->m_prev_goo = pOVar2;
  }
  if (this->m_goo != (uchar *)0x0) {
    onfree(this->m_goo);
    this->m_goo = (uchar *)0x0;
  }
  return;
}

Assistant:

ON_3dmGoo::~ON_3dmGoo()
{
  if ( m_prev_goo )
    m_prev_goo->m_next_goo = m_next_goo;
  if ( m_next_goo )
    m_next_goo->m_prev_goo = m_prev_goo;
  if ( m_goo ) {
    onfree(m_goo);
    m_goo = 0;
  }
}